

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void __thiscall CGL::GLScene::Mesh::render_in_opengl(Mesh *this)

{
  glEnable(0xb50);
  draw_faces(this);
  glDisable(0xb50);
  draw_edges(this);
  draw_feature_if_needed(this,&this->hoveredFeature);
  draw_feature_if_needed(this,&this->selectedFeature);
  glEnable(0xb50);
  return;
}

Assistant:

void Mesh::render_in_opengl() const {

  // TODO: fix drawing with BSDF
  // DiffuseBSDF* diffuse = dynamic_cast<DiffuseBSDF*>(bsdf);
  // if (diffuse) {
  //   glBindTexture(GL_TEXTURE_2D, 0);
  //   glMaterialfv(GL_FRONT, GL_DIFFUSE, diffuse->albedo.unsafe);
  // }

  // Enable lighting for faces
  glEnable(GL_LIGHTING);
  draw_faces();

  // Edges are drawn with flat shading.
  glDisable(GL_LIGHTING);
  draw_edges();

  // ONLY draw a vertex/half-edge if it's selected.
  draw_feature_if_needed(&hoveredFeature);
  draw_feature_if_needed(&selectedFeature);
  glEnable(GL_LIGHTING);
}